

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_dec.c
# Opt level: O3

int pgx_validate(jas_stream_t *in)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined8 in_RAX;
  ulong uVar4;
  uchar buf [2];
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  uVar2 = jas_stream_read(in,(void *)((long)&uStack_28 + 6),2);
  if (-1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
    do {
      if ((long)uVar4 < 1) {
        if ((int)uVar2 < 2) {
          return -1;
        }
        return -(uint)((ushort)(uStack_28._6_2_ << 8 | uStack_28._6_2_ >> 8) != 0x5047);
      }
      lVar1 = uVar4 + 5;
      uVar4 = uVar4 - 1;
      iVar3 = jas_stream_ungetc(in,(uint)*(byte *)((long)&uStack_28 + lVar1));
    } while (iVar3 != -1);
  }
  return -1;
}

Assistant:

int pgx_validate(jas_stream_t *in)
{
	jas_uchar buf[PGX_MAGICLEN];
	uint_fast32_t magic;
	int i;
	int n;

	assert(JAS_STREAM_MAXPUTBACK >= PGX_MAGICLEN);

	/* Read the validation data (i.e., the data used for detecting
	  the format). */
	if ((n = jas_stream_read(in, buf, PGX_MAGICLEN)) < 0) {
		return -1;
	}

	/* Put the validation data back onto the stream, so that the
	  stream position will not be changed. */
	for (i = n - 1; i >= 0; --i) {
		if (jas_stream_ungetc(in, buf[i]) == EOF) {
			return -1;
		}
	}

	/* Did we read enough data? */
	if (n < PGX_MAGICLEN) {
		return -1;
	}

	/* Compute the signature value. */
	magic = (buf[0] << 8) | buf[1];

	/* Ensure that the signature is correct for this format. */
	if (magic != PGX_MAGIC) {
		return -1;
	}

	return 0;
}